

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::EndsWith::~EndsWith(EndsWith *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__EndsWith_00237d38;
  CasedString::~CasedString((CasedString *)0x1a10aa);
  MatcherImpl<Catch::Matchers::Impl::StdString::EndsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl((MatcherImpl<Catch::Matchers::Impl::StdString::EndsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a10b4);
  return;
}

Assistant:

Matchers::Impl::StdString::EndsWith::~EndsWith() {}